

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow_p.h
# Opt level: O2

int __thiscall QMdiSubWindowPrivate::titleBarHeight(QMdiSubWindowPrivate *this)

{
  QWidget *this_00;
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  QStyleOptionTitleBar options;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  undefined1 *local_58;
  Data *pDStack_50;
  char16_t *local_48;
  undefined1 *puStack_40;
  QIcon local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  if ((*(long *)&(this->super_QWidgetPrivate).field_0x10 != 0) &&
     (this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8, iVar2 = 0,
     ((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
      super_QFlagsStorage<Qt::WindowType>.i & 0x800) == 0)) {
    bVar1 = QWidget::isMaximized(this_00);
    if (bVar1) {
      bVar1 = drawTitleBarWhenMaximized(this);
      if (!bVar1) goto LAB_0041d4c3;
    }
    local_38.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pDStack_50 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    titleBarOptions((QStyleOptionTitleBar *)&local_98,this);
    iVar2 = (uStack_80._4_4_ - local_88._4_4_) + 1;
    bVar1 = hasBorder(this,(QStyleOptionTitleBar *)&local_98);
    if (bVar1) {
      bVar1 = QWidget::isMinimized(this_00);
      iVar2 = iVar2 + (uint)bVar1 * 4 + 4;
    }
    QStyleOptionTitleBar::~QStyleOptionTitleBar((QStyleOptionTitleBar *)&local_98);
  }
LAB_0041d4c3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

inline int titleBarHeight() const
    {
        Q_Q(const QMdiSubWindow);
        if (!parent || q->windowFlags() & Qt::FramelessWindowHint
            || (q->isMaximized() && !drawTitleBarWhenMaximized())) {
            return 0;
        }
        QStyleOptionTitleBar options = titleBarOptions();
        int height = options.rect.height();
        if (hasBorder(options))
            height += q->isMinimized() ? 8 : 4;
        return height;
    }